

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

void __thiscall
Js::JavascriptGenerator::MarkVisitKindSpecificPtrs
          (JavascriptGenerator *this,SnapshotExtractor *extractor)

{
  ushort uVar1;
  RegSlot RVar2;
  ScriptFunction **ppSVar3;
  InterpreterStackFrame **ppIVar4;
  InterpreterStackFrame *pIVar5;
  FunctionBody *this_00;
  Var var;
  Var curr_1;
  uint32 i_1;
  uint32 argCount;
  Var curr;
  RegSlot i;
  RegSlot slotCount;
  SnapshotExtractor *extractor_local;
  JavascriptGenerator *this_local;
  
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunction__
                      ((WriteBarrierPtr *)&this->scriptFunction);
  if (*ppSVar3 != (ScriptFunction *)0x0) {
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunction__
                        ((WriteBarrierPtr *)&this->scriptFunction);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppSVar3);
  }
  ppIVar4 = Memory::WriteBarrierPtr::operator_cast_to_InterpreterStackFrame__
                      ((WriteBarrierPtr *)&this->frame);
  if (*ppIVar4 != (InterpreterStackFrame *)0x0) {
    pIVar5 = Memory::WriteBarrierPtr<Js::InterpreterStackFrame>::operator->(&this->frame);
    this_00 = InterpreterStackFrame::GetFunctionBody(pIVar5);
    RVar2 = FunctionBody::GetLocalsCount(this_00);
    for (curr._0_4_ = 0; (uint)curr < RVar2; curr._0_4_ = (uint)curr + 1) {
      pIVar5 = Memory::WriteBarrierPtr<Js::InterpreterStackFrame>::operator->(&this->frame);
      if (*(Var *)(pIVar5 + (ulong)(uint)curr * 8 + 0x160) != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar
                  (extractor,*(Var *)(pIVar5 + (ulong)(uint)curr * 8 + 0x160));
      }
    }
  }
  if ((this->args).Values != (Type)0x0) {
    uVar1 = Arguments::GetArgCountWithExtraArgs(&this->args);
    for (curr_1._0_4_ = 0; (uint)curr_1 < uVar1; curr_1._0_4_ = (uint)curr_1 + 1) {
      var = Arguments::operator[](&this->args,(uint)curr_1);
      if (var != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
      }
    }
  }
  return;
}

Assistant:

void JavascriptGenerator::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    if (this->scriptFunction != nullptr)
    {
        extractor->MarkVisitVar(this->scriptFunction);
    }

    // frame is null when generator has been completed
    if (this->frame != nullptr)
    {
        // mark slot variables for traversal
        Js::RegSlot slotCount = this->frame->GetFunctionBody()->GetLocalsCount();
        for (Js::RegSlot i = 0; i < slotCount; i++)
        {
            Js::Var curr = this->frame->m_localSlots[i];
            if (curr != nullptr)
            {
                extractor->MarkVisitVar(curr);
            }
        }
    }

    // args.Values is null when generator has been completed
    if (this->args.Values != nullptr)
    {
        // mark argument variables for traversal
        uint32 argCount = this->args.GetArgCountWithExtraArgs();
        for (uint32 i = 0; i < argCount; i++)
        {
            Js::Var curr = this->args[i];
            if (curr != nullptr)
            {
                extractor->MarkVisitVar(curr);
            }
        }
    }
}